

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O1

void __thiscall
MultiQuery<dto::Simple,_dto::Simple>::on_output(MultiQuery<dto::Simple,_dto::Simple> *this,Poll *p)

{
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  Error *this_00;
  string data;
  undefined1 local_69;
  shared_ptr<Alarm> local_68;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  anon_class_16_2_fd512ddd local_38;
  
  uVar1 = (this->req).header.cmd_seq;
  sVar2 = (this->req).payload._M_string_length;
  (this->req).header.cmd_seq =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)sVar2 + '\x12');
  plVar4 = local_58;
  *(undefined2 *)(local_58 + 2) = *(undefined2 *)((long)&(this->req).header.cmd_seq + 6);
  lVar3 = *(long *)((this->req).header.cmd + 8);
  *plVar4 = *(long *)(this->req).header.cmd;
  plVar4[1] = lVar3;
  plVar4 = local_58;
  memcpy((void *)((long)local_58 + 0x12),(this->req).payload._M_dataplus._M_p,
         (this->req).payload._M_string_length);
  uVar1 = (this->req).header.cmd_seq;
  (this->req).header.cmd_seq =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  sVar5 = sendto((this->super_Subscriber).fd,plVar4,local_50,0,(sockaddr *)&this->remote,0x10);
  if (sVar5 == local_50) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"MultiQuery: sent ",0x11);
    poVar6 = operator<<((ostream *)&std::cout,&this->req);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    Subscriber::set_expected(&this->super_Subscriber,1);
    Poll::notify_subscriber_changed(p,&this->super_Subscriber);
    if (this->timeout < 1) {
      Poll::unsubscribe(p,&this->super_Subscriber);
    }
    else {
      local_68.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_38.this = this;
      local_38.p = p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Alarm,std::allocator<Alarm>,int&,MultiQuery<dto::Simple,dto::Simple>::on_output(Poll&)::_lambda()_1_>
                (&local_68.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Alarm **)&local_68,(allocator<Alarm> *)&local_69,&this->timeout,&local_38);
      Poll::subscribe_alarm(p,&local_68);
      if (local_68.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Could not write");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void MultiQuery<REQ, RES>::on_output(Poll &p) {
  auto data = dto::marshall(this->req);
  if (sendto(fd, &data[0], data.size(), 0, (struct sockaddr *) &remote, sizeof(remote)) != data.size()) {
    throw Error("Could not write");
  }
  std::cout << "MultiQuery: sent " << this->req << std::endl;
  set_expected(POLLIN);
  p.notify_subscriber_changed(*this);
  if (this->timeout > 0) {
    p.subscribe_alarm(std::make_shared<Alarm>(this->timeout, [&] {
      if (this->done)
        this->done();
      p.unsubscribe(*this);
    }));
  } else {
    p.unsubscribe(*this);
  }
}